

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RingDecomposerLib.c
# Opt level: O3

uint RDL_getSSSR(RDL_data *data,RDL_cycle ***ptr)

{
  RDL_graph *pRVar1;
  char *pcVar2;
  RDL_URFinfo **ppRVar3;
  RDL_URFinfo *pRVar4;
  long *plVar5;
  long lVar6;
  uchar uVar7;
  uint size;
  int iVar8;
  uint nof_rows;
  uchar **rows;
  uchar **rows_00;
  uchar *empty_cycle;
  uchar *bitset;
  undefined8 *puVar9;
  void *pvVar10;
  RDL_cycle **ppRVar11;
  int iVar12;
  RDL_BCCGraph *pRVar13;
  ulong uVar14;
  uint uVar15;
  uint *puVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  int iVar20;
  uchar **compressed;
  ulong uVar21;
  uint local_9c;
  void *local_80;
  int local_68;
  int local_64;
  ulong local_60;
  
  if (data == (RDL_data *)0x0) {
    (*RDL_outputFunc)(RDL_ERROR,"RDL_data is NULL!\n");
    ppRVar11 = (RDL_cycle **)malloc(8);
    local_9c = 0xffffffff;
  }
  else if (data->nofURFs == 0) {
    ppRVar11 = (RDL_cycle **)malloc(8);
    local_9c = 0;
  }
  else {
    pRVar1 = data->graph;
    local_60 = 0x40;
    if (pRVar1->V <= pRVar1->E) {
      local_60 = (ulong)((pRVar1->E - pRVar1->V) + 1);
    }
    local_80 = malloc(local_60 * 8);
    pRVar13 = data->bccGraphs;
    if (pRVar13->nof_bcc == 0) {
      local_9c = 0;
    }
    else {
      puVar16 = data->nofURFsPerBCC;
      uVar18 = 0;
      size = 0;
      local_68 = 0;
      iVar20 = 0;
      local_9c = 0;
      do {
        pRVar1 = pRVar13->bcc_graphs[uVar18];
        iVar12 = pRVar1->E - pRVar1->V;
        rows = (uchar **)malloc((ulong)(iVar12 + 1) << 3);
        uVar15 = puVar16[uVar18];
        rows_00 = (uchar **)malloc((ulong)uVar15 * 8);
        if ((ulong)uVar15 != 0) {
          uVar17 = 0;
          compressed = rows_00;
          do {
            size = RDL_bitset_compressed
                             (compressed,(*data->urfInfoPerBCC[uVar18]->URFs[uVar17])->prototype,
                              pRVar1->E);
            uVar17 = uVar17 + 1;
            puVar16 = data->nofURFsPerBCC;
            compressed = compressed + 1;
          } while (uVar17 < puVar16[uVar18]);
        }
        uVar17 = (ulong)size;
        empty_cycle = (uchar *)calloc(1,uVar17);
        if (puVar16[uVar18] != 0) {
          uVar14 = 0;
          uVar15 = 0;
          local_64 = 0;
          do {
            bitset = (uchar *)malloc(uVar17);
            memcpy(bitset,rows_00[uVar14],uVar17);
            if (uVar15 != 0) {
              uVar21 = 0;
              do {
                uVar7 = RDL_bitset_test(bitset,(uint)uVar21);
                if (uVar7 != '\0') {
                  RDL_bitset_xor_inplace(bitset,rows[uVar21],size);
                }
                uVar21 = uVar21 + 1;
              } while (uVar15 != uVar21);
            }
            iVar8 = RDL_bitset_empty(bitset,empty_cycle,size);
            if (iVar8 == 0) {
              rows[uVar15] = bitset;
              nof_rows = uVar15 + 1;
              uVar7 = RDL_bitset_test(bitset,uVar15);
              if ((uVar7 == '\0') && (uVar19 = nof_rows, nof_rows < pRVar1->E)) {
                do {
                  uVar7 = RDL_bitset_test(bitset,uVar19);
                  if (uVar7 != '\0') {
                    RDL_swap_columns(rows,nof_rows,uVar15,uVar19);
                    RDL_swap_columns(rows_00,data->nofURFsPerBCC[uVar18],uVar15,uVar19);
                    break;
                  }
                  uVar19 = uVar19 + 1;
                } while (uVar19 < pRVar1->E);
              }
              pcVar2 = (*data->urfInfoPerBCC[uVar18]->URFs[uVar14])->prototype;
              if ((uint)local_60 <= local_9c) {
                local_60 = (ulong)((uint)local_60 * 2);
                local_80 = realloc(local_80,local_60 * 8);
              }
              puVar9 = (undefined8 *)malloc(0x18);
              *(undefined8 **)((long)local_80 + (ulong)local_9c * 8) = puVar9;
              ppRVar3 = data->urfInfoPerBCC;
              pvVar10 = malloc((ulong)(*ppRVar3[uVar18]->URFs[uVar14])->weight << 3);
              *puVar9 = pvVar10;
              pRVar4 = ppRVar3[uVar18];
              plVar5 = *(long **)((long)local_80 + (ulong)local_9c * 8);
              *(uint *)(plVar5 + 1) = (*pRVar4->URFs[uVar14])->weight;
              *(int *)((long)plVar5 + 0xc) = iVar20;
              *(int *)(plVar5 + 2) = local_68;
              uVar15 = pRVar1->E;
              if (uVar15 != 0) {
                uVar21 = 0;
                uVar19 = 0;
                do {
                  if (pcVar2[uVar21] == '\x01') {
                    puVar16 = data->graph->edges
                              [data->bccGraphs->edge_from_bcc_mapping[uVar18][uVar21]];
                    lVar6 = *plVar5;
                    *(uint *)(lVar6 + (ulong)uVar19 * 8) = *puVar16;
                    *(uint *)(lVar6 + 4 + (ulong)uVar19 * 8) = puVar16[1];
                    uVar19 = uVar19 + 1;
                    uVar15 = pRVar1->E;
                  }
                  uVar21 = uVar21 + 1;
                } while (uVar21 < uVar15);
              }
              local_68 = local_68 + pRVar4->nofCFsPerURF[uVar14];
              local_9c = local_9c + 1;
              uVar15 = nof_rows;
              if (local_64 == iVar12) break;
              local_64 = local_64 + 1;
            }
            else {
              free(bitset);
            }
            uVar14 = uVar14 + 1;
            iVar20 = iVar20 + 1;
          } while (uVar14 < data->nofURFsPerBCC[uVar18]);
          if (uVar15 != 0) {
            uVar17 = 0;
            do {
              free(rows[uVar17]);
              uVar17 = uVar17 + 1;
            } while (uVar15 != uVar17);
          }
        }
        free(rows);
        puVar16 = data->nofURFsPerBCC;
        if (puVar16[uVar18] != 0) {
          uVar17 = 0;
          do {
            free(rows_00[uVar17]);
            uVar17 = uVar17 + 1;
            puVar16 = data->nofURFsPerBCC;
          } while (uVar17 < puVar16[uVar18]);
        }
        free(rows_00);
        free(empty_cycle);
        uVar18 = uVar18 + 1;
        pRVar13 = data->bccGraphs;
      } while (uVar18 < pRVar13->nof_bcc);
    }
    ppRVar11 = (RDL_cycle **)realloc(local_80,(ulong)local_9c << 3);
  }
  *ptr = ppRVar11;
  return local_9c;
}

Assistant:

unsigned RDL_getSSSR(const RDL_data *data, RDL_cycle ***ptr)
{
  unsigned j, k, rcf=0, urf=0;
  RDL_cycle **result;
  unsigned size, added, currBond;
  unsigned bcc_index, internal_index;
  char* prototype;
  const RDL_graph* curr_graph;
  unsigned total_counter, alloced;
  unsigned edge;
  unsigned char *currentCycle;
  unsigned char **basisCycles;
  unsigned char **prototypesForGaussian;
  unsigned currentBasisCyclesSize;
  unsigned oldBasisCyclesSize;
  unsigned compressedSize = 0;
  const unsigned char* empty_cycle;


  if (!data) {
    RDL_outputFunc(RDL_ERROR, "RDL_data is NULL!\n");
    (*ptr) = malloc(sizeof(**ptr));
    return RDL_INVALID_RESULT;
  }

  if (data->nofURFs < 1) {
    (*ptr) = malloc(sizeof(**ptr));
    return 0;
  }

  total_counter = 0;
  if (data->graph->E < data->graph->V) {
    /*
     * if E - V + 1 < 1  <=> E - V < 0 <=> E < V
     *
     * graph is not connected and our heuristic for reservation
     * fails => allocate something ;)
     * */
    alloced = RDL_RESERVED_START;
  }
  else {
    alloced = data->graph->E - data->graph->V + 1;
  }
  result = malloc(alloced * sizeof(*result));

  /* calculate basis for each BCC (and therefore for each CC) */

  for (bcc_index = 0; bcc_index < data->bccGraphs->nof_bcc; ++bcc_index) {
    curr_graph = data->bccGraphs->bcc_graphs[bcc_index];

    size=curr_graph->E - curr_graph->V + 1;

    basisCycles = malloc(size * sizeof(*basisCycles));
    prototypesForGaussian =
        malloc(data->nofURFsPerBCC[bcc_index] * sizeof(*prototypesForGaussian));

    /* copy the prototypes for gaussian elimination */
    /*
     * it is sufficient to take the first prototype for each URF
     * (the other's are linearly dependent anyway
     */
    for (internal_index = 0;
        internal_index < data->nofURFsPerBCC[bcc_index]; ++internal_index) {
      compressedSize = RDL_bitset_compressed(&(prototypesForGaussian[internal_index]),
          data->urfInfoPerBCC[bcc_index]->URFs[internal_index][0]->prototype,
          curr_graph->E);
    }

    empty_cycle = malloc(compressedSize * sizeof(*empty_cycle));
    memset((unsigned char*)empty_cycle, 0, compressedSize * sizeof(*empty_cycle));

    added = 0;
    currentBasisCyclesSize = 0;

    for (internal_index = 0;
        internal_index < data->nofURFsPerBCC[bcc_index]; ++internal_index, ++urf) {

      currentCycle = malloc(compressedSize * sizeof(*currentCycle));
      memcpy(currentCycle, prototypesForGaussian[internal_index],
          compressedSize * sizeof(*currentCycle));

      /*
       * basisCycles is in row echelon form!result = realloc(result, nextfree * sizeof(*result));
       * [this corresponds to "add row operation"]
       */
      for (k = 0; k < currentBasisCyclesSize; ++k) {
        if (RDL_bitset_test(currentCycle, k)) {
          RDL_bitset_xor_inplace(currentCycle, basisCycles[k], compressedSize);
        }
      }

      if (RDL_bitset_empty(currentCycle, empty_cycle, compressedSize)) {
        free(currentCycle);
        continue;
      }
      /*
       * the current cycle is indepedent of equal and smaller
       * sized cycles => part of the basis
       */
      oldBasisCyclesSize = currentBasisCyclesSize;
      basisCycles[currentBasisCyclesSize] = currentCycle;
      ++currentBasisCyclesSize;

      /*
       * this is where the magic is happening: ensure that the basis is
       * indeed in row echelon form (we use the property throughout the algorithm)
       *
       * swap columns such that indeed the current ring with index currentBasisCycleSize-1
       * has a 1 at column currentBasisCycleSize-1
       * => ROW ECHELON FORM
       *
       * [this corresponds to the "swap columns operation" of gaussian elimination]
       */
      if (!RDL_bitset_test(currentCycle, oldBasisCyclesSize)) {
        for (k = oldBasisCyclesSize + 1; k < curr_graph->E; ++k) {
          if (RDL_bitset_test(currentCycle, k)) {
            RDL_swap_columns(basisCycles, currentBasisCyclesSize, oldBasisCyclesSize, k);
            RDL_swap_columns(prototypesForGaussian, data->nofURFsPerBCC[bcc_index], oldBasisCyclesSize, k);
            break;
          }
        }
      }

      prototype = data->urfInfoPerBCC[bcc_index]->URFs[internal_index][0]->prototype;

      /* can happen for unconnected graphs */
      if (total_counter >= alloced) {
        alloced *= 2;
        result = realloc(result, (alloced) * sizeof(*result));
      }

      currBond = 0;
      result[total_counter] = malloc(sizeof(**result));
      result[total_counter]->edges = malloc(data->urfInfoPerBCC[bcc_index]->URFs[internal_index][0]->weight *
                                   sizeof(*(result[total_counter]->edges)));
      result[total_counter]->weight = data->urfInfoPerBCC[bcc_index]->URFs[internal_index][0]->weight;
      result[total_counter]->urf = urf;
      result[total_counter]->rcf = rcf;
      for(j=0; j < curr_graph->E; ++j) {
        if(prototype[j] == 1) {
          edge = data->bccGraphs->edge_from_bcc_mapping[bcc_index][j];
          result[total_counter]->edges[currBond][0] = data->graph->edges[edge][0];
          result[total_counter]->edges[currBond][1] = data->graph->edges[edge][1];
          ++currBond;
        }
      }

      rcf += data->urfInfoPerBCC[bcc_index]->nofCFsPerURF[internal_index];

      /*if enough inRDL_dependent cycles were found, break out of the loop*/
      ++total_counter;
      if(++added == size) {
        break;
      }
    }

    for (k = 0; k < currentBasisCyclesSize; ++k) {
      free(basisCycles[k]);
    }
    free(basisCycles);

    for (k = 0; k < data->nofURFsPerBCC[bcc_index]; ++k) {
      free(prototypesForGaussian[k]);
    }
    free(prototypesForGaussian);
    free((void*)empty_cycle);
  }

  result = realloc(result, total_counter * sizeof(*result));

  (*ptr) = result;
  return total_counter;
}